

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_getsockopt(int s,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  nn_sock *local_38;
  nn_sock *sock;
  size_t *psStack_28;
  int rc;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  int s_local;
  
  psStack_28 = optvallen;
  optvallen_local = (size_t *)optval;
  optval_local._0_4_ = option;
  optval_local._4_4_ = level;
  option_local = s;
  sock._4_4_ = nn_global_hold_socket(&local_38,s);
  if (sock._4_4_ < 0) {
    iVar1 = -sock._4_4_;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  else {
    if (optvallen_local == (size_t *)0x0 && psStack_28 != (size_t *)0x0) {
      sock._4_4_ = -0xe;
    }
    else {
      sock._4_4_ = nn_sock_getopt(local_38,optval_local._4_4_,(int)optval_local,optvallen_local,
                                  psStack_28);
      if (-1 < sock._4_4_) {
        if (sock._4_4_ == 0) {
          nn_global_rele_socket(local_38);
          return 0;
        }
        nn_backtrace_print();
        __stream = _stderr;
        pcVar3 = nn_err_strerror(-sock._4_4_);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-sock._4_4_,
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/global.c"
                ,0x25d);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    nn_global_rele_socket(local_38);
    iVar1 = -sock._4_4_;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return -1;
}

Assistant:

int nn_getsockopt (int s, int level, int option, void *optval,
    size_t *optvallen)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!optval && optvallen)) {
        rc = -EFAULT;
        goto fail;
    }

    rc = nn_sock_getopt (sock, level, option, optval, optvallen);
    if (nn_slow (rc < 0))
        goto fail;
    errnum_assert (rc == 0, -rc);
    nn_global_rele_socket (sock);
    return 0;

fail:
    nn_global_rele_socket (sock);
    errno = -rc;
    return -1;
}